

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O0

S64 __thiscall I2sSimulationDataGenerator::GetNextAudioWord(I2sSimulationDataGenerator *this)

{
  uint uVar1;
  reference pvVar2;
  size_type sVar3;
  value_type local_18;
  S64 value;
  I2sSimulationDataGenerator *this_local;
  
  if (this->mCurrentAudioChannel == Left) {
    pvVar2 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       (&this->mSineWaveSamplesLeft,(ulong)this->mCurrentAudioWordIndex);
    local_18 = *pvVar2;
    this->mCurrentAudioChannel = Right;
  }
  else {
    pvVar2 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       (&this->mSineWaveSamplesLeft,(ulong)this->mCurrentAudioWordIndex);
    local_18 = *pvVar2;
    this->mCurrentAudioChannel = Left;
    this->mCurrentAudioWordIndex = this->mCurrentAudioWordIndex + 1;
    uVar1 = this->mCurrentAudioWordIndex;
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->mSineWaveSamplesLeft);
    if (sVar3 <= uVar1) {
      this->mCurrentAudioWordIndex = 0;
    }
  }
  return local_18;
}

Assistant:

S64 I2sSimulationDataGenerator::GetNextAudioWord()
{
    S64 value;

    // return 0xFFFF;

    if( mCurrentAudioChannel == Left )
    {
        value = mSineWaveSamplesLeft[ mCurrentAudioWordIndex ];
        mCurrentAudioChannel = Right;
    }
    else
    {
        value = mSineWaveSamplesLeft[ mCurrentAudioWordIndex ];
        mCurrentAudioChannel = Left;
        mCurrentAudioWordIndex++;
        if( mCurrentAudioWordIndex >= mSineWaveSamplesLeft.size() )
            mCurrentAudioWordIndex = 0;
    }

    return value;
}